

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

Resource res_findResource_63(ResourceData *pResData,Resource r,char **path,char **key)

{
  Resource RVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  char *__s;
  uint uVar7;
  char *closeIndex;
  ResourceData *local_48;
  char **local_40;
  int32_t local_34;
  
  pcVar2 = *path;
  closeIndex = (char *)0x0;
  if (*pcVar2 != '\0') {
    uVar6 = r >> 0x1c;
    __s = pcVar2;
    local_48 = pResData;
    local_40 = key;
    if ((uVar6 == 2) || ((r & 0xe0000000) == 0x40000000)) {
      while ((pcVar2 != (char *)0x0 && ((*__s != '\0' && (r != 0xffffffff))))) {
        uVar7 = uVar6 & 0xe;
        if ((uVar6 != 2) && ((uVar7 != 8 && (uVar7 != 4)))) {
          return r;
        }
        pcVar2 = strchr(__s,0x2f);
        if (pcVar2 == (char *)0x0) {
          sVar4 = strlen(__s);
          pcVar3 = __s + sVar4;
        }
        else {
          if (pcVar2 == __s) goto LAB_002b6141;
          *pcVar2 = '\0';
          pcVar3 = pcVar2 + 1;
        }
        *path = pcVar3;
        if (uVar6 == 2 || uVar7 == 4) {
          *local_40 = __s;
          RVar1 = res_getTableItemByKey_63(local_48,r,&local_34,local_40);
          if (RVar1 == 0xffffffff) {
            lVar5 = strtol(__s,&closeIndex,10);
            RVar1 = 0xffffffff;
            if ((-1 < (int)lVar5) && (RVar1 = 0xffffffff, *closeIndex == '\0')) {
              RVar1 = res_getTableItemByIndex_63(local_48,r,(int)lVar5,local_40);
            }
          }
        }
        else {
          RVar1 = 0xffffffff;
          if (uVar7 == 8) {
            lVar5 = strtol(__s,&closeIndex,10);
            RVar1 = 0xffffffff;
            if ((-1 < (int)lVar5) && (RVar1 = 0xffffffff, *closeIndex == '\0')) {
              RVar1 = res_getArrayItem_63(local_48,r,(int)lVar5);
            }
            *local_40 = (char *)0x0;
          }
        }
        uVar6 = RVar1 >> 0x1c;
        __s = *path;
        r = RVar1;
      }
    }
    else {
LAB_002b6141:
      r = 0xffffffff;
    }
  }
  return r;
}

Assistant:

U_CFUNC Resource
res_findResource(const ResourceData *pResData, Resource r, char** path, const char** key) {
  char *pathP = *path, *nextSepP = *path;
  char *closeIndex = NULL;
  Resource t1 = r;
  Resource t2;
  int32_t indexR = 0;
  UResType type = (UResType)RES_GET_TYPE(t1);

  /* if you come in with an empty path, you'll be getting back the same resource */
  if(!uprv_strlen(pathP)) {
      return r;
  }

  /* one needs to have an aggregate resource in order to search in it */
  if(!URES_IS_CONTAINER(type)) {
      return RES_BOGUS;
  }
  
  while(nextSepP && *pathP && t1 != RES_BOGUS && URES_IS_CONTAINER(type)) {
    /* Iteration stops if: the path has been consumed, we found a non-existing
     * resource (t1 == RES_BOGUS) or we found a scalar resource (including alias)
     */
    nextSepP = uprv_strchr(pathP, RES_PATH_SEPARATOR);
    /* if there are more separators, terminate string 
     * and set path to the remaining part of the string
     */
    if(nextSepP != NULL) {
      if(nextSepP == pathP) {
        // Empty key string.
        return RES_BOGUS;
      }
      *nextSepP = 0; /* overwrite the separator with a NUL to terminate the key */
      *path = nextSepP+1;
    } else {
      *path = uprv_strchr(pathP, 0);
    }

    /* if the resource is a table */
    /* try the key based access */
    if(URES_IS_TABLE(type)) {
      *key = pathP;
      t2 = res_getTableItemByKey(pResData, t1, &indexR, key);
      if(t2 == RES_BOGUS) { 
        /* if we fail to get the resource by key, maybe we got an index */
        indexR = uprv_strtol(pathP, &closeIndex, 10);
        if(indexR >= 0 && *closeIndex == 0) {
          /* if we indeed have an index, try to get the item by index */
          t2 = res_getTableItemByIndex(pResData, t1, indexR, key);
        } // else t2 is already RES_BOGUS
      }
    } else if(URES_IS_ARRAY(type)) {
      indexR = uprv_strtol(pathP, &closeIndex, 10);
      if(indexR >= 0 && *closeIndex == 0) {
        t2 = res_getArrayItem(pResData, t1, indexR);
      } else {
        t2 = RES_BOGUS; /* have an array, but don't have a valid index */
      }
      *key = NULL;
    } else { /* can't do much here, except setting t2 to bogus */
      t2 = RES_BOGUS;
    }
    t1 = t2;
    type = (UResType)RES_GET_TYPE(t1);
    /* position pathP to next resource key/index */
    pathP = *path;
  }

  return t1;
}